

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_initialize_rd_consts(AV1_COMP *cpi)

{
  FRAME_TYPE FVar1;
  long lVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *pvVar8;
  FRAME_CONTEXT *in_RDI;
  CoeffCosts *unaff_retaddr;
  INTER_MODE_SPEED_FEATURES *inter_sf;
  int qindex_rdmult;
  FRAME_TYPE frame_type;
  int layer_depth;
  int boost_index;
  GF_GROUP *gf_group;
  int frames_since_key;
  int use_nonrd_pick_mode;
  RD_OPT *rd;
  SPEED_FEATURES *sf;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int use_nonrd_pick_mode_00;
  INTERNAL_COST_UPDATE_TYPE in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  AV1_COMP *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined3 in_stack_ffffffffffffffa0;
  aom_tune_metric tuning;
  int local_58;
  int local_54;
  undefined8 in_stack_ffffffffffffffb0;
  FRAME_CONTEXT *fc;
  undefined3 in_stack_ffffffffffffffbc;
  undefined4 uVar10;
  int iVar11;
  AV1_COMMON *cm_00;
  FRAME_CONTEXT *fc_00;
  
  iVar7 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  cm_00 = (AV1_COMMON *)(in_RDI[0xb].nmvc.comps[0].class0_fp_cdf[0] + 1);
  lVar2 = *(long *)in_RDI->txb_skip_cdf[0];
  if (*(int *)(*(long *)in_RDI->txb_skip_cdf[0] + 0x8b3c) / 100 < 0x10) {
    local_54 = *(int *)(*(long *)in_RDI->txb_skip_cdf[0] + 0x8b3c) / 100;
  }
  else {
    local_54 = 0xf;
  }
  if (*(int *)(lVar2 + 0x480 + (ulong)(byte)in_RDI[0x15].intra_ext_tx_cdf[1][1][1][7] * 4) < 6) {
    local_58 = *(int *)(lVar2 + 0x480 + (ulong)(byte)in_RDI[0x15].intra_ext_tx_cdf[1][1][1][7] * 4);
  }
  else {
    local_58 = 6;
  }
  FVar1 = (cm_00->current_frame).frame_type;
  uVar10 = CONCAT13(FVar1,in_stack_ffffffffffffffbc);
  iVar4 = *(int *)(in_RDI[0xb].filter_intra_cdfs[0] + 1) +
          *(int *)(in_RDI[0xb].filter_intra_cdfs[1] + 2);
  iVar6 = *(int *)(*(long *)(in_RDI[0xc].intra_ext_tx_cdf[0][0][7] + 4) + 0x48);
  tuning = CONCAT13(FVar1,in_stack_ffffffffffffffa0);
  uVar9 = *(undefined4 *)(in_RDI[0xc].intra_ext_tx_cdf[0][2][10] + 0xb);
  iVar11 = local_58;
  fc_00 = in_RDI;
  iVar5 = is_stat_consumption_stage
                    ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  use_nonrd_pick_mode_00 = *(int *)(fc_00[0xc].intra_ext_tx_cdf[1][0][4] + 0xb);
  iVar6 = av1_compute_rd_mult((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                              (aom_bit_depth_t)in_stack_ffffffffffffff80,
                              (FRAME_UPDATE_TYPE)((ulong)in_stack_ffffffffffffff78 >> 0x38),
                              (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                              (FRAME_TYPE)((uint)in_stack_ffffffffffffff70 >> 0x18),iVar6,local_58,
                              tuning);
  *(int *)in_RDI[0x12].comp_ref_type_cdf[2] = iVar6;
  av1_set_error_per_bit
            ((int *)(in_RDI[8].coeff_base_cdf[1][0] + 5),*(int *)in_RDI[0x12].comp_ref_type_cdf[2]);
  set_block_thresholds
            ((AV1_COMMON *)CONCAT44(local_54,iVar11),(RD_OPT *)CONCAT44(uVar10,iVar4),iVar7);
  populate_unified_cost_update_freq
            (*(CostUpdateFreq *)(fc_00[0xc].intra_ext_tx_cdf[1][0][7] + 0xe),
             (SPEED_FEATURES *)(in_RDI[0x12].uv_mode_cdf[0][7] + 8));
  fc = (FRAME_CONTEXT *)(fc_00[0x12].uv_mode_cdf[1][9] + 1);
  iVar7 = is_frame_level_cost_upd_freq_set
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,use_nonrd_pick_mode_00,in_stack_ffffffffffffff64);
  if (iVar7 != 0) {
    av1_fill_mv_costs((nmv_context *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff6c,use_nonrd_pick_mode_00,
                      (MvCosts *)CONCAT44(in_stack_ffffffffffffff64,iVar5));
  }
  iVar7 = is_frame_level_cost_upd_freq_set
                    ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,use_nonrd_pick_mode_00,in_stack_ffffffffffffff64);
  if (iVar7 != 0) {
    in_stack_ffffffffffffff78 = (AV1_COMP *)(in_RDI[6].coeff_br_cdf[0][0][0x12] + 3);
    av1_num_planes(cm_00);
    av1_fill_coeff_costs(unaff_retaddr,fc_00,(int)((ulong)cm_00 >> 0x20));
  }
  iVar7 = should_force_mode_cost_update(in_stack_ffffffffffffff78);
  if ((iVar7 != 0) ||
     (iVar7 = is_frame_level_cost_upd_freq_set
                        ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                         ,in_stack_ffffffffffffff6c,use_nonrd_pick_mode_00,in_stack_ffffffffffffff64
                        ), iVar7 != 0)) {
    av1_fill_mode_rates((AV1_COMMON *)CONCAT44(local_54,iVar11),(ModeCosts *)CONCAT44(uVar10,iVar4),
                        fc);
  }
  _Var3 = av1_need_dv_costs((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,iVar5));
  if (_Var3) {
    if (*(long *)(fc_00[0xb].coeff_base_cdf[4][1][8] + 1) == 0) {
      pvVar8 = aom_malloc(0x2d44ce);
      *(void **)(fc_00[0xb].coeff_base_cdf[4][1][8] + 1) = pvVar8;
      if (*(long *)(fc_00[0xb].coeff_base_cdf[4][1][8] + 1) == 0) {
        aom_internal_error(cm_00->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->td.dv_costs_alloc");
      }
      *(undefined8 *)(fc_00[6].coeff_br_cdf[0][0][0x11] + 4) =
           *(undefined8 *)(fc_00[0xb].coeff_base_cdf[4][1][8] + 1);
    }
    av1_fill_dv_costs((nmv_context *)CONCAT44(in_stack_ffffffffffffff64,iVar5),
                      (IntraBCMVCosts *)CONCAT44(in_stack_ffffffffffffff5c,uVar9));
  }
  return;
}

Assistant:

void av1_initialize_rd_consts(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &cpi->td.mb;
  SPEED_FEATURES *const sf = &cpi->sf;
  RD_OPT *const rd = &cpi->rd;
  int use_nonrd_pick_mode = cpi->sf.rt_sf.use_nonrd_pick_mode;
  int frames_since_key = cpi->rc.frames_since_key;

  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const int boost_index = AOMMIN(15, (cpi->ppi->p_rc.gfu_boost / 100));
  const int layer_depth = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const FRAME_TYPE frame_type = cm->current_frame.frame_type;

  const int qindex_rdmult =
      cm->quant_params.base_qindex + cm->quant_params.y_dc_delta_q;
  rd->RDMULT = av1_compute_rd_mult(
      qindex_rdmult, cm->seq_params->bit_depth,
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index], layer_depth,
      boost_index, frame_type, cpi->oxcf.q_cfg.use_fixed_qp_offsets,
      is_stat_consumption_stage(cpi), cpi->oxcf.tune_cfg.tuning);
#if CONFIG_RD_COMMAND
  if (cpi->oxcf.pass == 2) {
    const RD_COMMAND *rd_command = &cpi->rd_command;
    if (rd_command->option_ls[rd_command->frame_index] ==
        RD_OPTION_SET_Q_RDMULT) {
      rd->RDMULT = rd_command->rdmult_ls[rd_command->frame_index];
    }
  }
#endif  // CONFIG_RD_COMMAND

  av1_set_error_per_bit(&x->errorperbit, rd->RDMULT);

  set_block_thresholds(cm, rd, cpi->sf.rt_sf.use_nonrd_pick_mode);

  populate_unified_cost_update_freq(cpi->oxcf.cost_upd_freq, sf);
  const INTER_MODE_SPEED_FEATURES *const inter_sf = &cpi->sf.inter_sf;
  // Frame level mv cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->mv_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mv_costs(&cm->fc->nmvc, cm->features.cur_frame_force_integer_mv,
                      cm->features.allow_high_precision_mv, x->mv_costs);

  // Frame level coefficient cost update
  if (is_frame_level_cost_upd_freq_set(cm, inter_sf->coeff_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_coeff_costs(&x->coeff_costs, cm->fc, av1_num_planes(cm));

  // Frame level mode cost update
  if (should_force_mode_cost_update(cpi) ||
      is_frame_level_cost_upd_freq_set(cm, inter_sf->mode_cost_upd_level,
                                       use_nonrd_pick_mode, frames_since_key))
    av1_fill_mode_rates(cm, &x->mode_costs, cm->fc);

  // Frame level dv cost update
  if (av1_need_dv_costs(cpi)) {
    if (cpi->td.dv_costs_alloc == NULL) {
      CHECK_MEM_ERROR(
          cm, cpi->td.dv_costs_alloc,
          (IntraBCMVCosts *)aom_malloc(sizeof(*cpi->td.dv_costs_alloc)));
      cpi->td.mb.dv_costs = cpi->td.dv_costs_alloc;
    }
    av1_fill_dv_costs(&cm->fc->ndvc, x->dv_costs);
  }
}